

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateInlineAccessorDefinitions
          (MessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline const $type$& $classname$::_internal_$name$() const {\n$type_reference_function$  const $type$* p = $casted_member$;\n  return p != nullptr ? *p : reinterpret_cast<const $type$&>(\n      $type_default_instance$);\n}\ninline const $type$& $classname$::$name$() const {\n$annotate_get$  // @@protoc_insertion_point(field_get:$full_name$)\n  return _internal_$name$();\n}\n"
            );
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline void $classname$::unsafe_arena_set_allocated_$name$(\n    $type$* $name$) {\n  if (GetArenaForAllocation() == nullptr) {\n    delete reinterpret_cast<::$proto_ns$::MessageLite*>($name$_);\n  }\n"
            );
  if ((this->implicit_weak_field_ & 1U) == 0) {
    Formatter::operator()<>((Formatter *)local_50,"  $name$_ = $name$;\n");
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "  $name$_ = reinterpret_cast<::$proto_ns$::MessageLite*>($name$);\n");
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "  if ($name$) {\n    $set_hasbit$\n  } else {\n    $clear_hasbit$\n  }\n$annotate_set$  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:$full_name$)\n}\n"
            );
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline $type$* $classname$::$release_name$() {\n$type_reference_function$$annotate_release$  $clear_hasbit$\n  $type$* temp = $casted_member$;\n  $name$_ = nullptr;\n#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE\n  auto* old =  reinterpret_cast<::$proto_ns$::MessageLite*>(temp);\n  temp = ::$proto_ns$::internal::DuplicateIfNonNull(temp);\n  if (GetArenaForAllocation() == nullptr) { delete old; }\n#else  // PROTOBUF_FORCE_COPY_IN_RELEASE\n  if (GetArenaForAllocation() != nullptr) {\n    temp = ::$proto_ns$::internal::DuplicateIfNonNull(temp);\n  }\n#endif  // !PROTOBUF_FORCE_COPY_IN_RELEASE\n  return temp;\n}\ninline $type$* $classname$::unsafe_arena_release_$name$() {\n$annotate_release$  // @@protoc_insertion_point(field_release:$full_name$)\n$type_reference_function$  $clear_hasbit$\n  $type$* temp = $casted_member$;\n  $name$_ = nullptr;\n  return temp;\n}\n"
            );
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline $type$* $classname$::_internal_mutable_$name$() {\n$type_reference_function$  $set_hasbit$\n  if ($name$_ == nullptr) {\n    auto* p = CreateMaybeMessage<$type$>(GetArenaForAllocation());\n"
            );
  if ((this->implicit_weak_field_ & 1U) == 0) {
    Formatter::operator()<>((Formatter *)local_50,"    $name$_ = p;\n");
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "    $name$_ = reinterpret_cast<::$proto_ns$::MessageLite*>(p);\n");
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "  }\n  return $casted_member$;\n}\ninline $type$* $classname$::mutable_$name$() {\n  $type$* _msg = _internal_mutable_$name$();\n$annotate_mutable$  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return _msg;\n}\n"
            );
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline void $classname$::set_allocated_$name$($type$* $name$) {\n  ::$proto_ns$::Arena* message_arena = GetArenaForAllocation();\n"
            );
  Formatter::operator()<>((Formatter *)local_50,"  if (message_arena == nullptr) {\n");
  bVar1 = IsCrossFileMessage((this->super_FieldGenerator).descriptor_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "    delete reinterpret_cast< ::$proto_ns$::MessageLite*>($name$_);\n");
  }
  else {
    Formatter::operator()<>((Formatter *)local_50,"    delete $name$_;\n");
  }
  Formatter::operator()<>((Formatter *)local_50,"  }\n  if ($name$) {\n");
  bVar1 = IsCrossFileMessage((this->super_FieldGenerator).descriptor_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "    ::$proto_ns$::Arena* submessage_arena =\n        ::$proto_ns$::Arena::InternalHelper<\n            ::$proto_ns$::MessageLite>::GetOwningArena(\n                reinterpret_cast<::$proto_ns$::MessageLite*>($name$));\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "    ::$proto_ns$::Arena* submessage_arena =\n        ::$proto_ns$::Arena::InternalHelper<$type$>::GetOwningArena($name$);\n"
              );
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "    if (message_arena != submessage_arena) {\n      $name$ = ::$proto_ns$::internal::GetOwnedMessage(\n          message_arena, $name$, submessage_arena);\n    }\n    $set_hasbit$\n  } else {\n    $clear_hasbit$\n  }\n"
            );
  if ((this->implicit_weak_field_ & 1U) == 0) {
    Formatter::operator()<>((Formatter *)local_50,"  $name$_ = $name$;\n");
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,"  $name$_ = reinterpret_cast<MessageLite*>($name$);\n");
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "$annotate_set$  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n}\n");
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "inline const $type$& $classname$::_internal_$name$() const {\n"
      "$type_reference_function$"
      "  const $type$* p = $casted_member$;\n"
      "  return p != nullptr ? *p : reinterpret_cast<const $type$&>(\n"
      "      $type_default_instance$);\n"
      "}\n"
      "inline const $type$& $classname$::$name$() const {\n"
      "$annotate_get$"
      "  // @@protoc_insertion_point(field_get:$full_name$)\n"
      "  return _internal_$name$();\n"
      "}\n");

  format(
      "inline void $classname$::unsafe_arena_set_allocated_$name$(\n"
      "    $type$* $name$) {\n"
      // If we're not on an arena, free whatever we were holding before.
      // (If we are on arena, we can just forget the earlier pointer.)
      "  if (GetArenaForAllocation() == nullptr) {\n"
      "    delete reinterpret_cast<::$proto_ns$::MessageLite*>($name$_);\n"
      "  }\n");
  if (implicit_weak_field_) {
    format(
        "  $name$_ = "
        "reinterpret_cast<::$proto_ns$::MessageLite*>($name$);\n");
  } else {
    format("  $name$_ = $name$;\n");
  }
  format(
      "  if ($name$) {\n"
      "    $set_hasbit$\n"
      "  } else {\n"
      "    $clear_hasbit$\n"
      "  }\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_unsafe_arena_set_allocated"
      ":$full_name$)\n"
      "}\n");
  format(
      "inline $type$* $classname$::$release_name$() {\n"
      "$type_reference_function$"
      "$annotate_release$"
      "  $clear_hasbit$\n"
      "  $type$* temp = $casted_member$;\n"
      "  $name$_ = nullptr;\n"
      "#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE\n"
      "  auto* old =  reinterpret_cast<::$proto_ns$::MessageLite*>(temp);\n"
      "  temp = ::$proto_ns$::internal::DuplicateIfNonNull(temp);\n"
      "  if (GetArenaForAllocation() == nullptr) { delete old; }\n"
      "#else  // PROTOBUF_FORCE_COPY_IN_RELEASE\n"
      "  if (GetArenaForAllocation() != nullptr) {\n"
      "    temp = ::$proto_ns$::internal::DuplicateIfNonNull(temp);\n"
      "  }\n"
      "#endif  // !PROTOBUF_FORCE_COPY_IN_RELEASE\n"
      "  return temp;\n"
      "}\n"
      "inline $type$* $classname$::unsafe_arena_release_$name$() {\n"
      "$annotate_release$"
      "  // @@protoc_insertion_point(field_release:$full_name$)\n"
      "$type_reference_function$"
      "  $clear_hasbit$\n"
      "  $type$* temp = $casted_member$;\n"
      "  $name$_ = nullptr;\n"
      "  return temp;\n"
      "}\n");

  format(
      "inline $type$* $classname$::_internal_mutable_$name$() {\n"
      "$type_reference_function$"
      "  $set_hasbit$\n"
      "  if ($name$_ == nullptr) {\n"
      "    auto* p = CreateMaybeMessage<$type$>(GetArenaForAllocation());\n");
  if (implicit_weak_field_) {
    format("    $name$_ = reinterpret_cast<::$proto_ns$::MessageLite*>(p);\n");
  } else {
    format("    $name$_ = p;\n");
  }
  format(
      "  }\n"
      "  return $casted_member$;\n"
      "}\n"
      "inline $type$* $classname$::mutable_$name$() {\n"
      "  $type$* _msg = _internal_mutable_$name$();\n"
      "$annotate_mutable$"
      "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
      "  return _msg;\n"
      "}\n");

  // We handle the most common case inline, and delegate less common cases to
  // the slow fallback function.
  format(
      "inline void $classname$::set_allocated_$name$($type$* $name$) {\n"
      "  ::$proto_ns$::Arena* message_arena = GetArenaForAllocation();\n");
  format("  if (message_arena == nullptr) {\n");
  if (IsCrossFileMessage(descriptor_)) {
    format(
        "    delete reinterpret_cast< ::$proto_ns$::MessageLite*>($name$_);\n");
  } else {
    format("    delete $name$_;\n");
  }
  format(
      "  }\n"
      "  if ($name$) {\n");
  if (IsCrossFileMessage(descriptor_)) {
    // We have to read the arena through the virtual method, because the type
    // isn't defined in this file.
    format(
        "    ::$proto_ns$::Arena* submessage_arena =\n"
        "        ::$proto_ns$::Arena::InternalHelper<\n"
        "            ::$proto_ns$::MessageLite>::GetOwningArena(\n"
        "                reinterpret_cast<::$proto_ns$::MessageLite*>("
        "$name$));\n");
  } else {
    format(
        "    ::$proto_ns$::Arena* submessage_arena =\n"
        "        ::$proto_ns$::Arena::InternalHelper<$type$>::GetOwningArena("
        "$name$);\n");
  }
  format(
      "    if (message_arena != submessage_arena) {\n"
      "      $name$ = ::$proto_ns$::internal::GetOwnedMessage(\n"
      "          message_arena, $name$, submessage_arena);\n"
      "    }\n"
      "    $set_hasbit$\n"
      "  } else {\n"
      "    $clear_hasbit$\n"
      "  }\n");
  if (implicit_weak_field_) {
    format("  $name$_ = reinterpret_cast<MessageLite*>($name$);\n");
  } else {
    format("  $name$_ = $name$;\n");
  }
  format(
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
      "}\n");
}